

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::wrapContext(Exception *this,char *file,int line,String *description)

{
  String *params_2;
  Maybe<kj::Own<kj::Exception::Context>_> *params_3;
  Own<kj::Exception::Context> local_48;
  Maybe<kj::Own<kj::Exception::Context>_> local_38;
  String *local_28;
  String *description_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  Exception *this_local;
  
  local_28 = description;
  description_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)this;
  params_2 = mv<kj::String>(description);
  params_3 = mv<kj::Maybe<kj::Own<kj::Exception::Context>>>(&this->context);
  heap<kj::Exception::Context,char_const*&,int&,kj::String,kj::Maybe<kj::Own<kj::Exception::Context>>>
            ((kj *)&local_48,&stack0xffffffffffffffe8,(int *)((long)&description_local + 4),params_2
             ,params_3);
  Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&local_38,&local_48);
  Maybe<kj::Own<kj::Exception::Context>_>::operator=(&this->context,&local_38);
  Maybe<kj::Own<kj::Exception::Context>_>::~Maybe(&local_38);
  Own<kj::Exception::Context>::~Own(&local_48);
  return;
}

Assistant:

void Exception::wrapContext(const char* file, int line, String&& description) {
  context = heap<Context>(file, line, mv(description), mv(context));
}